

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_lore_drop_base(parser *p)

{
  wchar_t wVar1;
  uint uVar2;
  void *pvVar3;
  char *name;
  undefined8 *puVar4;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  pVar5 = PARSE_ERROR_NONE;
  if (pvVar3 != (void *)0x0) {
    name = parser_getsym(p,"tval");
    wVar1 = tval_find_idx(name);
    if (wVar1 < L'\0') {
      pVar5 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      uVar2 = parser_getuint(p,"min");
      pVar5 = PARSE_ERROR_INVALID_ITEM_NUMBER;
      if (uVar2 < 100) {
        uVar2 = parser_getuint(p,"max");
        if (uVar2 < 100) {
          puVar4 = (undefined8 *)mem_zalloc(0x20);
          *(wchar_t *)(puVar4 + 2) = wVar1;
          uVar2 = parser_getuint(p,"chance");
          *(uint *)((long)puVar4 + 0x14) = uVar2;
          uVar2 = parser_getuint(p,"min");
          *(uint *)(puVar4 + 3) = uVar2;
          uVar2 = parser_getuint(p,"max");
          *(uint *)((long)puVar4 + 0x1c) = uVar2;
          *puVar4 = *(undefined8 *)((long)pvVar3 + 0x38);
          *(undefined8 **)((long)pvVar3 + 0x38) = puVar4;
          pVar5 = PARSE_ERROR_NONE;
        }
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_lore_drop_base(struct parser *p) {
	struct monster_lore *l = parser_priv(p);
	struct monster_drop *d;
	int tval;

	if (!l)
		return PARSE_ERROR_NONE;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;

	if (parser_getuint(p, "min") > 99 || parser_getuint(p, "max") > 99)
		return PARSE_ERROR_INVALID_ITEM_NUMBER;

	d = mem_zalloc(sizeof *d);
	d->tval = tval;
	d->percent_chance = parser_getuint(p, "chance");
	d->min = parser_getuint(p, "min");
	d->max = parser_getuint(p, "max");
	d->next = l->drops;
	l->drops = d;
	return PARSE_ERROR_NONE;
}